

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ<absl::lts_20250127::Cord,absl::lts_20250127::Cord>
          (internal *this,char *lhs_expression,char *rhs_expression,Cord *lhs,Cord *rhs)

{
  bool bVar1;
  ulong uVar2;
  size_t size_to_compare;
  undefined1 auVar4 [16];
  AssertionResult AVar5;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var3;
  
  auVar4[0] = -((rhs->contents_).data_.rep_.field_0.data[0] ==
               (lhs->contents_).data_.rep_.field_0.data[0]);
  auVar4[1] = -((rhs->contents_).data_.rep_.field_0.data[1] ==
               (lhs->contents_).data_.rep_.field_0.data[1]);
  auVar4[2] = -((rhs->contents_).data_.rep_.field_0.data[2] ==
               (lhs->contents_).data_.rep_.field_0.data[2]);
  auVar4[3] = -((rhs->contents_).data_.rep_.field_0.data[3] ==
               (lhs->contents_).data_.rep_.field_0.data[3]);
  auVar4[4] = -((rhs->contents_).data_.rep_.field_0.data[4] ==
               (lhs->contents_).data_.rep_.field_0.data[4]);
  auVar4[5] = -((rhs->contents_).data_.rep_.field_0.data[5] ==
               (lhs->contents_).data_.rep_.field_0.data[5]);
  auVar4[6] = -((rhs->contents_).data_.rep_.field_0.data[6] ==
               (lhs->contents_).data_.rep_.field_0.data[6]);
  auVar4[7] = -((rhs->contents_).data_.rep_.field_0.data[7] ==
               (lhs->contents_).data_.rep_.field_0.data[7]);
  auVar4[8] = -((rhs->contents_).data_.rep_.field_0.data[8] ==
               (lhs->contents_).data_.rep_.field_0.data[8]);
  auVar4[9] = -((rhs->contents_).data_.rep_.field_0.data[9] ==
               (lhs->contents_).data_.rep_.field_0.data[9]);
  auVar4[10] = -((rhs->contents_).data_.rep_.field_0.data[10] ==
                (lhs->contents_).data_.rep_.field_0.data[10]);
  auVar4[0xb] = -((rhs->contents_).data_.rep_.field_0.data[0xb] ==
                 (lhs->contents_).data_.rep_.field_0.data[0xb]);
  auVar4[0xc] = -((rhs->contents_).data_.rep_.field_0.data[0xc] ==
                 (lhs->contents_).data_.rep_.field_0.data[0xc]);
  auVar4[0xd] = -((rhs->contents_).data_.rep_.field_0.data[0xd] ==
                 (lhs->contents_).data_.rep_.field_0.data[0xd]);
  auVar4[0xe] = -((rhs->contents_).data_.rep_.field_0.data[0xe] ==
                 (lhs->contents_).data_.rep_.field_0.data[0xe]);
  auVar4[0xf] = -((rhs->contents_).data_.rep_.field_0.data[0xf] ==
                 (lhs->contents_).data_.rep_.field_0.data[0xf]);
  if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf) ==
      0xffff) {
LAB_0018ef3e:
    AVar5 = AssertionSuccess();
    _Var3._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )AVar5.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  }
  else {
    uVar2 = (ulong)(rhs->contents_).data_.rep_.field_0.data[0];
    if ((uVar2 & 1) == 0) {
      size_to_compare = uVar2 >> 1;
    }
    else {
      size_to_compare = ((rhs->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    uVar2 = (ulong)(lhs->contents_).data_.rep_.field_0.data[0];
    if ((uVar2 & 1) == 0) {
      uVar2 = uVar2 >> 1;
    }
    else {
      uVar2 = ((lhs->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    if (uVar2 == size_to_compare) {
      bVar1 = absl::lts_20250127::Cord::EqualsImpl(lhs,rhs,size_to_compare);
      if (bVar1) goto LAB_0018ef3e;
    }
    AVar5 = CmpHelperEQFailure<absl::lts_20250127::Cord,absl::lts_20250127::Cord>
                      (this,lhs_expression,rhs_expression,lhs,rhs);
    _Var3._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )AVar5.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  }
  AVar5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var3._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression, const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}